

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxsolver.hpp
# Opt level: O3

int __thiscall soplex::SPxSolverBase<double>::init(SPxSolverBase<double> *this,EVP_PKEY_CTX *ctx)

{
  SPxBasisBase<double> *this_00;
  double dVar1;
  int in_EAX;
  int extraout_EAX;
  int extraout_EAX_00;
  SPxStatus SVar2;
  int extraout_EAX_01;
  int extraout_EAX_02;
  int iVar3;
  SPxRatioTester<double> *pSVar4;
  double dVar5;
  
  if (this->initialized == false) {
    this->initialized = true;
    (*(this->super_SPxLPBase<double>).super_LPRowSetBase<double>.super_SVSetBase<double>.
      super_ClassArray<soplex::Nonzero<double>_>._vptr_ClassArray[0x88])(this);
    in_EAX = (*(this->super_SPxLPBase<double>).super_LPRowSetBase<double>.super_SVSetBase<double>.
               super_ClassArray<soplex::Nonzero<double>_>._vptr_ClassArray[0x79])(this);
    if (((this->super_SPxBasisBase<double>).thestatus < SINGULAR) ||
       ((this->super_SPxBasisBase<double>).theLP != this)) {
      SPxBasisBase<double>::load(&this->super_SPxBasisBase<double>,this,true);
      in_EAX = extraout_EAX;
    }
    this->initialized = false;
  }
  this_00 = &this->super_SPxBasisBase<double>;
  if ((this->super_SPxBasisBase<double>).matrixIsSetup == false) {
    SPxBasisBase<double>::loadDesc(this_00,&(this->super_SPxBasisBase<double>).thedesc);
    in_EAX = extraout_EAX_00;
  }
  if ((this->super_SPxBasisBase<double>).thestatus == SINGULAR) {
    return in_EAX;
  }
  if ((this->thecovectors->set).thenum == 0) {
    (this->super_SPxBasisBase<double>).factorized = true;
  }
  else if (((this->super_SPxBasisBase<double>).factorized & 1U) == 0) {
    SPxBasisBase<double>::factorize(this_00);
  }
  this->m_numCycle = 0;
  if (this->theType == ENTER) {
    if (this->theRep == COLUMN) {
      setPrimalBounds(this);
      if (this->m_status == OPTIMAL) {
        this->m_status = UNKNOWN;
      }
      SVar2 = PRIMAL;
      if ((this->super_SPxBasisBase<double>).thestatus != PRIMAL) {
LAB_001e2da2:
        (this->super_SPxBasisBase<double>).thestatus = SVar2;
      }
    }
    else {
      setDualRowBounds(this);
      if (this->m_status == OPTIMAL) {
        this->m_status = UNKNOWN;
      }
      SVar2 = DUAL;
      if ((this->super_SPxBasisBase<double>).thestatus != DUAL) goto LAB_001e2da2;
    }
    (*(this->super_SPxLPBase<double>).super_LPRowSetBase<double>.super_SVSetBase<double>.
      super_ClassArray<soplex::Nonzero<double>_>._vptr_ClassArray[0x8d])(this);
    (*(this->super_SPxLPBase<double>).super_LPRowSetBase<double>.super_SVSetBase<double>.
      super_ClassArray<soplex::Nonzero<double>_>._vptr_ClassArray[0x7c])(this);
    DIdxSet::setMax(&this->infeasibilities,(this->thecovectors->set).thenum);
    DIdxSet::setMax(&this->infeasibilitiesCo,(this->thevectors->set).thenum);
    DataArray<int>::reSize(&this->isInfeasible,(this->thecovectors->set).thenum);
    DataArray<int>::reSize(&this->isInfeasibleCo,(this->thevectors->set).thenum);
    pSVar4 = this->theratiotester;
    entertol(this);
    goto LAB_001e2e27;
  }
  if (this->theRep == ROW) {
    setPrimalBounds(this);
    if (this->m_status == OPTIMAL) {
      this->m_status = UNKNOWN;
    }
    SVar2 = PRIMAL;
    if ((this->super_SPxBasisBase<double>).thestatus != PRIMAL) goto LAB_001e2cbf;
  }
  else {
    setDualColBounds(this);
    if (this->m_status == OPTIMAL) {
      this->m_status = UNKNOWN;
    }
    SVar2 = DUAL;
    if ((this->super_SPxBasisBase<double>).thestatus != DUAL) {
LAB_001e2cbf:
      (this->super_SPxBasisBase<double>).thestatus = SVar2;
    }
  }
  (*(this->super_SPxLPBase<double>).super_LPRowSetBase<double>.super_SVSetBase<double>.
    super_ClassArray<soplex::Nonzero<double>_>._vptr_ClassArray[0x8e])(this);
  (*(this->super_SPxLPBase<double>).super_LPRowSetBase<double>.super_SVSetBase<double>.
    super_ClassArray<soplex::Nonzero<double>_>._vptr_ClassArray[0x7d])(this);
  DIdxSet::setMax(&this->infeasibilities,(this->thecovectors->set).thenum);
  DataArray<int>::reSize(&this->isInfeasible,(this->thecovectors->set).thenum);
  pSVar4 = this->theratiotester;
  leavetol(this);
LAB_001e2e27:
  (*pSVar4->_vptr_SPxRatioTester[4])(pSVar4);
  SPxBasisBase<double>::coSolve(this_00,&this->theCoPvec->super_VectorBase<double>,this->theCoPrhs);
  computePvec(this);
  computeFrhs(this);
  SPxBasisBase<double>::solve(this_00,&this->theFvec->super_VectorBase<double>,this->theFrhs);
  this->theShift = 0.0;
  if (this->theType == ENTER) {
    shiftFvec(this);
    dVar1 = this->theShift;
    dVar5 = entertol(this);
    this->lastShift = dVar5 + dVar1;
    computeCoTest(this);
    computeTest(this);
    iVar3 = extraout_EAX_02;
  }
  else {
    shiftPvec(this);
    dVar1 = this->theShift;
    dVar5 = leavetol(this);
    this->lastShift = dVar5 + dVar1;
    computeFtest(this);
    iVar3 = extraout_EAX_01;
  }
  if (this->initialized == false) {
    (*this->thepricer->_vptr_SPxPricer[1])(this->thepricer,this);
    iVar3 = (*this->theratiotester->_vptr_SPxRatioTester[1])(this->theratiotester,this);
    this->initialized = true;
  }
  return iVar3;
}

Assistant:

void SPxSolverBase<R>::init()
   {

      assert(thepricer      != nullptr);
      assert(theratiotester != nullptr);

      if(!initialized)
      {
         initialized = true;
         clearUpdateVecs();
         reDim();

         if(SPxBasisBase<R>::status() <= SPxBasisBase<R>::NO_PROBLEM || this->solver() != this)
            SPxBasisBase<R>::load(this);

         initialized = false;
      }

      if(!this->matrixIsSetup)
         SPxBasisBase<R>::loadDesc(this->desc());

      // Inna/Tobi: don't "upgrade" a singular basis to a regular one
      if(SPxBasisBase<R>::status() == SPxBasisBase<R>::SINGULAR)
         return;

      // catch pathological case for LPs with zero constraints
      if(dim() == 0)
      {
         this->factorized = true;
      }

      // we better factorize explicitly before solving
      if(!this->factorized)
      {
         try
         {
            SPxBasisBase<R>::factorize();
         }
         catch(const SPxException&)
         {
            // reload inital slack basis in case the factorization failed
            assert(SPxBasisBase<R>::status() <= SPxBasisBase<R>::SINGULAR);
            SPxBasisBase<R>::restoreInitialBasis();
            SPxBasisBase<R>::factorize();
            assert(this->factorized);
         }
      }

      m_numCycle = 0;

      if(type() == ENTER)
      {
         if(rep() == COLUMN)
         {
            setPrimalBounds();
            setBasisStatus(SPxBasisBase<R>::PRIMAL);
         }
         else
         {
            setDualRowBounds();
            setBasisStatus(SPxBasisBase<R>::DUAL);
         }

         setEnterBounds();
         computeEnterCoPrhs();
         // prepare support vectors for sparse pricing
         infeasibilities.setMax(dim());
         infeasibilitiesCo.setMax(coDim());
         isInfeasible.reSize(dim());
         isInfeasibleCo.reSize(coDim());
         theratiotester->setDelta(entertol());
      }
      else
      {
         if(rep() == ROW)
         {
            setPrimalBounds();
            setBasisStatus(SPxBasisBase<R>::PRIMAL);
         }
         else
         {
            setDualColBounds();
            setBasisStatus(SPxBasisBase<R>::DUAL);
         }

         setLeaveBounds();
         computeLeaveCoPrhs();
         // prepare support vectors for sparse pricing
         infeasibilities.setMax(dim());
         isInfeasible.reSize(dim());
         theratiotester->setDelta(leavetol());
      }

      SPxBasisBase<R>::coSolve(*theCoPvec, *theCoPrhs);
      computePvec();
      computeFrhs();
      SPxBasisBase<R>::solve(*theFvec, *theFrhs);

      theShift = 0.0;

      if(type() == ENTER)
      {
         shiftFvec();
         lastShift = theShift + entertol();

         computeCoTest();
         computeTest();
      }
      else
      {
         shiftPvec();
         lastShift = theShift + leavetol();

         computeFtest();
      }

      if(!initialized)
      {
         // if(thepricer->solver() != this)
         thepricer->load(this);
         // if(theratiotester->solver() != this)
         theratiotester->load(this);
         initialized = true;
      }
   }